

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::anon_unknown_0::ImageSizeMachine::CheckProgram(ImageSizeMachine *this,GLuint program)

{
  long lVar1;
  char *format;
  CallLogWrapper *this_00;
  bool bVar2;
  GLint length_1;
  GLenum type;
  GLint attached_shaders;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  GLint status;
  GLint length;
  int local_78;
  allocator_type local_71;
  int local_70;
  int local_6c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  GLuint local_50;
  int local_4c;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if (program == 0) {
    bVar2 = true;
  }
  else {
    this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
    glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b82,&local_4c);
    if (local_4c == 0) {
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b85,&local_6c);
      if (0 < (long)local_6c) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68,(long)local_6c,
                   (allocator_type *)&local_48);
        local_50 = program;
        glu::CallLogWrapper::glGetAttachedShaders
                  (this_00,program,local_6c,(GLsizei *)0x0,
                   local_68._M_impl.super__Vector_impl_data._M_start);
        for (lVar1 = 0; lVar1 < local_6c; lVar1 = lVar1 + 1) {
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,local_68._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b4f,
                     &local_70);
          if (local_70 == 0x8b30) {
            format = "*** Fragment Shader ***\n";
          }
          else {
            format = "*** Vertex Shader ***\n";
            if (local_70 != 0x8b31) {
              if (local_70 == 0x8dd9) {
                format = "*** Geometry Shader ***\n";
              }
              else if (local_70 == 0x8e87) {
                format = "*** Tessellation Evaluation Shader ***\n";
              }
              else if (local_70 == 0x8e88) {
                format = "*** Tessellation Control Shader ***\n";
              }
              else if (local_70 == 0x91b9) {
                format = "*** Compute Shader ***\n";
              }
              else {
                format = "*** Unknown Shader ***\n";
              }
            }
          }
          anon_unknown_0::Output(format);
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,local_68._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b88,
                     &local_78);
          if (0 < (long)local_78) {
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_48,(long)local_78,&local_71);
            glu::CallLogWrapper::glGetShaderSource
                      (this_00,local_68._M_impl.super__Vector_impl_data._M_start[lVar1],local_78,
                       (GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_48._M_impl.super__Vector_impl_data._M_start));
            anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_48._M_impl.super__Vector_impl_data._M_start));
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
          }
          glu::CallLogWrapper::glGetShaderiv
                    (this_00,local_68._M_impl.super__Vector_impl_data._M_start[lVar1],0x8b84,
                     &local_78);
          if (0 < (long)local_78) {
            std::vector<char,_std::allocator<char>_>::vector
                      ((vector<char,_std::allocator<char>_> *)&local_48,(long)local_78,&local_71);
            glu::CallLogWrapper::glGetShaderInfoLog
                      (this_00,local_68._M_impl.super__Vector_impl_data._M_start[lVar1],local_78,
                       (GLsizei *)0x0,
                       (GLchar *)
                       CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)local_48._M_impl.super__Vector_impl_data._M_start));
            anon_unknown_0::Output
                      ("%s\n",CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)local_48._M_impl.super__Vector_impl_data._M_start));
            std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
          }
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_68);
        program = local_50;
      }
      glu::CallLogWrapper::glGetProgramiv(this_00,program,0x8b84,(GLint *)&local_48);
      if (0 < (long)(int)local_48._M_impl.super__Vector_impl_data._M_start) {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&local_68,
                   (long)(int)local_48._M_impl.super__Vector_impl_data._M_start,
                   (allocator_type *)&local_70);
        glu::CallLogWrapper::glGetProgramInfoLog
                  (this_00,program,(int)local_48._M_impl.super__Vector_impl_data._M_start,
                   (GLsizei *)0x0,(GLchar *)local_68._M_impl.super__Vector_impl_data._M_start);
        anon_unknown_0::Output("%s\n",local_68._M_impl.super__Vector_impl_data._M_start);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&local_68);
      }
    }
    bVar2 = local_4c == 1;
  }
  return bVar2;
}

Assistant:

bool CheckProgram(GLuint program)
	{
		if (program == 0)
			return true;
		GLint status;
		glGetProgramiv(program, GL_LINK_STATUS, &status);

		if (status == GL_FALSE)
		{
			GLint attached_shaders;
			glGetProgramiv(program, GL_ATTACHED_SHADERS, &attached_shaders);

			if (attached_shaders > 0)
			{
				std::vector<GLuint> shaders(attached_shaders);
				glGetAttachedShaders(program, attached_shaders, NULL, &shaders[0]);

				for (GLint i = 0; i < attached_shaders; ++i)
				{
					GLenum type;
					glGetShaderiv(shaders[i], GL_SHADER_TYPE, reinterpret_cast<GLint*>(&type));
					switch (type)
					{
					case GL_VERTEX_SHADER:
						Output("*** Vertex Shader ***\n");
						break;
					case GL_TESS_CONTROL_SHADER:
						Output("*** Tessellation Control Shader ***\n");
						break;
					case GL_TESS_EVALUATION_SHADER:
						Output("*** Tessellation Evaluation Shader ***\n");
						break;
					case GL_GEOMETRY_SHADER:
						Output("*** Geometry Shader ***\n");
						break;
					case GL_FRAGMENT_SHADER:
						Output("*** Fragment Shader ***\n");
						break;
					case GL_COMPUTE_SHADER:
						Output("*** Compute Shader ***\n");
						break;
					default:
						Output("*** Unknown Shader ***\n");
						break;
					}
					GLint length;
					glGetShaderiv(shaders[i], GL_SHADER_SOURCE_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> source(length);
						glGetShaderSource(shaders[i], length, NULL, &source[0]);
						Output("%s\n", &source[0]);
					}
					glGetShaderiv(shaders[i], GL_INFO_LOG_LENGTH, &length);
					if (length > 0)
					{
						std::vector<GLchar> log(length);
						glGetShaderInfoLog(shaders[i], length, NULL, &log[0]);
						Output("%s\n", &log[0]);
					}
				}
			}
			GLint length;
			glGetProgramiv(program, GL_INFO_LOG_LENGTH, &length);
			if (length > 0)
			{
				std::vector<GLchar> log(length);
				glGetProgramInfoLog(program, length, NULL, &log[0]);
				Output("%s\n", &log[0]);
			}
		}
		return status == GL_TRUE ? true : false;
	}